

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_CCtx_reset(ZSTD_CCtx *cctx,ZSTD_ResetDirective reset)

{
  int in_ESI;
  long in_RDI;
  undefined4 unaff_retaddr;
  undefined8 local_8;
  
  if ((in_ESI == 1) || (in_ESI == 3)) {
    *(undefined4 *)(in_RDI + 0xe00) = 0;
    *(undefined8 *)(in_RDI + 0x2e0) = 0;
  }
  if ((in_ESI == 2) || (in_ESI == 3)) {
    if (*(int *)(in_RDI + 0xe00) == 0) {
      ZSTD_clearAllDicts((ZSTD_CCtx *)CONCAT44(reset,unaff_retaddr));
      memset((void *)(in_RDI + 0x1458),0,0x20);
      local_8 = ZSTD_CCtxParams_reset((ZSTD_CCtx_params *)0x17b3d1);
    }
    else {
      local_8 = 0xffffffffffffffc4;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Reset parameters is only possible during init stage.");
        ZSTD_clearAllDicts(cctx);
        ZSTD_memset(&cctx->externalMatchCtx, 0, sizeof(cctx->externalMatchCtx));
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}